

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_io.cc
# Opt level: O2

void __thiscall
gimage::RAWImageIO::load
          (RAWImageIO *this,ImageU8 *image,char *name,int ds,long x,long y,long w,long h)

{
  size_t sVar1;
  ImageU8 *pIVar2;
  uchar uVar3;
  byte bVar4;
  int iVar5;
  IOException *pIVar6;
  ulong uVar7;
  size_t __n;
  long lVar8;
  long k;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long i;
  long lVar14;
  long lVar15;
  bool bVar16;
  undefined4 in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffcec;
  long width;
  bool msbfirst;
  long height;
  long local_2f0;
  ImageU8 *local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  int type;
  valarray<int> nline;
  valarray<int> vline;
  string filename;
  ifstream in;
  
  filename._M_dataplus._M_p = (pointer)&filename.field_2;
  filename._M_string_length = 0;
  filename.field_2._M_local_buf[0] = '\0';
  local_2f0 = y;
  local_2d0 = x;
  iVar5 = (*(this->super_BasicImageIO)._vptr_BasicImageIO[3])(this,name,1);
  local_2e8 = image;
  if ((char)iVar5 == '\0') {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&nline,name,(allocator *)&stack0xfffffffffffffcec);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   "Can only load RAW image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
    gutil::IOException::IOException(pIVar6,(string *)&in);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  (anonymous_namespace)::readRAWHeader_abi_cxx11_
            ((string *)&in,(_anonymous_namespace_ *)name,(char *)&type,(int *)&msbfirst,
             (bool *)&width,&height,
             (long *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8));
  std::__cxx11::string::operator=((string *)&filename,(string *)&in);
  std::__cxx11::string::~string((string *)&in);
  pIVar2 = local_2e8;
  if (1 < type) {
    pIVar6 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&nline,name,(allocator *)&stack0xfffffffffffffcec);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,
                   "A 16 bit image cannot be loaded as 8 bit image (",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nline);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vline,")");
    gutil::IOException::IOException(pIVar6,(string *)&in);
    __cxa_throw(pIVar6,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  uVar12 = 1;
  if (1 < ds) {
    uVar12 = (ulong)(uint)ds;
  }
  if (w < 0) {
    w = (long)(width + uVar12 + -1) / (long)uVar12;
  }
  if (h < 0) {
    h = (long)(height + uVar12 + -1) / (long)uVar12;
  }
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::setSize(local_2e8,w,h,1);
  sVar1 = pIVar2->n;
  __n = -sVar1;
  if (0 < (long)sVar1) {
    __n = sVar1;
  }
  memset(pIVar2->pixel,0,__n);
  std::ifstream::ifstream(&in);
  std::ios::exceptions((int)&in + (int)*(undefined8 *)(_in + -0x18));
  std::ifstream::open((char *)&in,(_Ios_Openmode)filename._M_dataplus._M_p);
  pIVar2 = local_2e8;
  if ((((ds < 2) && (local_2f0 == 0 && local_2d0 == 0)) && (w == width)) && (h == height)) {
    for (lVar9 = 0; lVar9 < h; lVar9 = lVar9 + 1) {
      for (lVar14 = 0; lVar14 < w; lVar14 = lVar14 + 1) {
        uVar3 = std::streambuf::sbumpc();
        (*pIVar2->img)[lVar9][lVar14] = uVar3;
        w = width;
      }
      h = height;
    }
  }
  else {
    nline._M_size._0_4_ = 0;
    std::valarray<int>::valarray(&vline,(int *)&nline,w);
    std::valarray<int>::valarray(&nline,(int *)&stack0xfffffffffffffcec,w);
    lVar9 = -local_2f0;
    if (-local_2f0 == 0 || 0 < local_2f0) {
      lVar9 = 0;
    }
    lVar14 = 0;
    if (0 < local_2d0) {
      lVar14 = local_2d0;
    }
    local_2d8 = -local_2d0;
    if (-local_2d0 == 0 || 0 < local_2d0) {
      local_2d8 = 0;
    }
    local_2e0 = (local_2d0 + local_2d8) * uVar12;
    for (; (lVar9 < h && (lVar8 = (lVar9 + local_2f0) * uVar12, lVar8 < height)); lVar9 = lVar9 + 1)
    {
      std::valarray<int>::operator=(&vline,(int *)&stack0xfffffffffffffcec);
      std::valarray<int>::operator=(&nline,(int *)&stack0xfffffffffffffcec);
      for (uVar7 = 0;
          (lVar10 = local_2e0, lVar15 = local_2d8, uVar7 != uVar12 &&
          (lVar13 = uVar7 + lVar8, lVar13 < height)); uVar7 = uVar7 + 1) {
        std::istream::seekg(&in,lVar13 * width + lVar14 * uVar12,0);
        lVar15 = local_2e0;
        for (lVar10 = local_2d8;
            (lVar10 < w &&
            (uVar11 = uVar12, lVar13 = lVar15, (long)((local_2d0 + lVar10) * uVar12) < width));
            lVar10 = lVar10 + 1) {
          for (; (bVar16 = uVar11 != 0, uVar11 = uVar11 - 1, bVar16 && (lVar13 < width));
              lVar13 = lVar13 + 1) {
            bVar4 = std::streambuf::sbumpc();
            vline._M_data[lVar10] = vline._M_data[lVar10] + (uint)bVar4;
            nline._M_data[lVar10] = nline._M_data[lVar10] + 1;
          }
          lVar15 = lVar15 + uVar12;
        }
      }
      for (; (lVar15 < w && (lVar10 < width)); lVar10 = lVar10 + uVar12) {
        if (0 < nline._M_data[lVar15]) {
          (*local_2e8->img)[lVar9][lVar15] = (uchar)(vline._M_data[lVar15] / nline._M_data[lVar15]);
        }
        lVar15 = lVar15 + 1;
      }
    }
    operator_delete(nline._M_data);
    operator_delete(vline._M_data);
  }
  std::ifstream::close();
  std::ifstream::~ifstream(&in);
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void RAWImageIO::load(ImageU8 &image, const char *name, int ds, long x, long y,
                      long w, long h) const
{
  std::string filename;
  long   width, height;
  int    type;
  bool   msbfirst;

  if (!handlesFile(name, true))
  {
    throw gutil::IOException("Can only load RAW image ("+std::string(name)+")");
  }

  filename=readRAWHeader(name, type, msbfirst, width, height);

  if (type > 1)
  {
    throw gutil::IOException("A 16 bit image cannot be loaded as 8 bit image ("+std::string(name)+")");
  }

  ds=std::max(1, ds);

  if (w < 0)
  {
    w=(width+ds-1)/ds;
  }

  if (h < 0)
  {
    h=(height+ds-1)/ds;
  }

  image.setSize(w, h, 1);
  image.clear();

  try
  {
    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
    in.open(filename.c_str(), std::ios::binary);

    // load downscaled part?

    if (ds > 1 || x != 0 || y != 0 || w != width || h != height)
    {
      std::valarray<ImageU8::work_t> vline(0, w);
      std::valarray<int> nline(0, w);

      for (long k=std::max(0l, -y); k<h && (y+k)*ds<height; k++)
      {
        // load downscaled line

        vline=0;
        nline=0;

        for (long kk=0; kk<ds && kk+(y+k)*ds<height; kk++)
        {
          in.seekg(static_cast<std::streamoff>((y+k)*ds+kk)*width+
                   static_cast<std::streamoff>(std::max(0l, x))*ds);

          std::streambuf *sb=in.rdbuf();

          long j=std::max(0l, -x);

          for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
          {
            for (int ii=0; ii<ds && (x+i)*ds+ii<width; ii++)
            {
              ImageU8::store_t v=static_cast<ImageU8::store_t>(sb->sbumpc());

              if (image.isValidS(v))
              {
                vline[j]+=v;
                nline[j]++;
              }
            }

            j++;
          }
        }

        // store line into image

        long j=std::max(0l, -x);

        for (long i=std::max(0l, -x); i<w && (x+i)*ds<width; i++)
        {
          if (nline[j] > 0)
          {
            image.set(i, k, 0, static_cast<ImageU8::store_t>(vline[j]/nline[j]));
          }

          j++;
        }
      }
    }
    else // load whole image
    {
      std::streambuf *sb=in.rdbuf();

      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          image.set(i, k, 0, static_cast<ImageU8::store_t>(sb->sbumpc()));
        }
      }
    }

    in.close();
  }
  catch (const std::ios_base::failure &ex)
  {
    throw gutil::IOException(ex.what());
  }
}